

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O1

bool tinyusdz::tydra::GetDirectlyBoundMaterial
               (Stage *_stage,Prim *prim,string *purpose,Path *materialPath,Material **material,
               string *err)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  ostringstream ss_e;
  string *local_1f0;
  Material **local_1e8;
  Path *local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  _Any_data local_1b8;
  code *local_1a8;
  code *pcStack_1a0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  local_1f0 = err;
  local_1e8 = material;
  local_1e0 = materialPath;
  if (materialPath == (Path *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc"
               ,0x5e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"GetDirectlyBoundMaterial",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<(local_198,0xb4);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    pcVar4 = "`materialPath` ptr is null.";
    lVar3 = 0x1b;
  }
  else {
    if (material != (Material **)0x0) {
      local_1a8 = (code *)0x0;
      pcStack_1a0 = (code *)0x0;
      local_1b8._M_unused._M_object = (void *)0x0;
      local_1b8._8_8_ = 0;
      local_1b8._M_unused._M_object = operator_new(0x20);
      *(string **)local_1b8._M_unused._0_8_ = purpose;
      *(Path ***)((long)local_1b8._M_unused._0_8_ + 8) = &local_1e0;
      *(string ***)((long)local_1b8._M_unused._0_8_ + 0x10) = &local_1f0;
      *(Material ****)((long)local_1b8._M_unused._0_8_ + 0x18) = &local_1e8;
      pcStack_1a0 = ::std::
                    _Function_handler<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc:187:20)>
                    ::_M_invoke;
      local_1a8 = ::std::
                  _Function_handler<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc:187:20)>
                  ::_M_manager;
      bVar1 = ApplyToMaterialBinding
                        (_stage,prim,
                         (function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*)>
                          *)&local_1b8);
      if (local_1a8 == (code *)0x0) {
        return bVar1;
      }
      (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
      return bVar1;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc"
               ,0x5e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"GetDirectlyBoundMaterial",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<(local_198,0xb8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    pcVar4 = "`material` ptr is null.";
    lVar3 = 0x17;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar4,lVar3);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  if (local_1f0 != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1d8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_198);
  ::std::ios_base::~ios_base(local_128);
  return false;
}

Assistant:

bool GetDirectlyBoundMaterial(
  const Stage &_stage,
  const Prim &prim,
  const std::string &purpose,
  tinyusdz::Path *materialPath,
  const Material **material,
  std::string *err) {

  if (!materialPath) {
    PUSH_ERROR_AND_RETURN("`materialPath` ptr is null.");
  }

  if (!material) {
    PUSH_ERROR_AND_RETURN("`material` ptr is null.");
  }

  auto apply_fun = [&](const Stage &stage, const MaterialBinding *mb) -> bool {

    Relationship mat_rel;
    if (!mb->get_materialBinding(value::token(purpose), &mat_rel)) {
      return false;
    }

    if (!GetSinglePath(mat_rel, materialPath)) {
      std::string binding_name = kMaterialBinding;
      if (!purpose.empty()) {
        binding_name += ":" + purpose;
      }
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be single targetPath", binding_name));
    }

    const Prim *p{nullptr};
    if (stage.find_prim_at_path(*materialPath, p, err)) {
      if (p->is<Material>()) {
        (*material) = p->as<Material>();
        return true;
      } else {
        (*material) = nullptr;
      }
    }

    return false;
  };

  bool ret = ApplyToMaterialBinding(_stage, prim, apply_fun);

  return ret;
}